

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Layer_*> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int count;
  ON_Layer *layer;
  int local_44;
  ON_Object *local_40;
  ON_Layer *local_38;
  
  if (a->m_a != (ON_Layer **)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 3);
  }
  a->m_count = 0;
  bVar1 = ReadInt32(this,1,&local_44);
  if (bVar1) {
    ON_SimpleArray<ON_Layer_*>::SetCapacity(a,(long)local_44);
    if (bVar1 && 0 < local_44) {
      iVar3 = 1;
      do {
        local_38 = (ON_Layer *)0x0;
        local_40 = (ON_Object *)0x0;
        iVar2 = ReadObjectHelper(this,&local_40);
        bVar1 = iVar2 == 1;
        if (bVar1) {
          local_38 = ON_Layer::Cast(local_40);
        }
        bVar4 = local_38 == (ON_Layer *)0x0;
        if (bVar4 || iVar2 != 1) {
          if (local_40 != (ON_Object *)0x0) {
            (*local_40->_vptr_ON_Object[4])();
          }
          bVar1 = false;
        }
        else {
          ON_SimpleArray<ON_Layer_*>::Append(a,&local_38);
        }
      } while ((!bVar4 && iVar2 == 1) &&
              (bVar4 = iVar3 < local_44, iVar3 = iVar3 + 1, bVar1 == true && bVar4));
    }
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<class ON_Layer*>& a)
{
  a.Empty();
  ON_Layer* layer;
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      layer = 0;
      ON_Object* p = 0;
      rc = (1==ReadObject(&p));
      if (rc)
      {
        layer = ON_Layer::Cast(p);
      }
      if (!rc || 0 == layer)
      {
        if ( p )
          delete p;
        rc = false;
        break;
      }
      a.Append(layer);
    }
  }
  return rc;
}